

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fspec.cc
# Opt level: O0

bool __thiscall
FuncCallSpecs::lateRestriction
          (FuncCallSpecs *this,FuncProto *restrictedProto,
          vector<Varnode_*,_std::allocator<Varnode_*>_> *newinput,Varnode **newoutput)

{
  bool bVar1;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  Varnode **newoutput_local;
  vector<Varnode_*,_std::allocator<Varnode_*>_> *newinput_local;
  FuncProto *restrictedProto_local;
  FuncCallSpecs *this_local;
  
  bVar1 = FuncProto::hasModel(&this->super_FuncProto);
  if (bVar1) {
    bVar1 = FuncProto::isCompatible(&this->super_FuncProto,restrictedProto);
    if (bVar1) {
      FuncProto::copy(&this->super_FuncProto,(EVP_PKEY_CTX *)restrictedProto,src_00);
      bVar1 = FuncProto::isDotdotdot(&this->super_FuncProto);
      if ((bVar1) && ((this->isinputactive & 1U) == 0)) {
        this_local._7_1_ = false;
      }
      else {
        bVar1 = FuncProto::isInputLocked(&this->super_FuncProto);
        if ((!bVar1) || (bVar1 = transferLockedInput(this,newinput), bVar1)) {
          bVar1 = FuncProto::isOutputLocked(&this->super_FuncProto);
          if ((!bVar1) || (bVar1 = transferLockedOutput(this,newoutput), bVar1)) {
            this_local._7_1_ = true;
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    FuncProto::copy(&this->super_FuncProto,(EVP_PKEY_CTX *)restrictedProto,src);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool FuncCallSpecs::lateRestriction(const FuncProto &restrictedProto,vector<Varnode *> &newinput,Varnode *&newoutput)

{
  if (!hasModel()) {
    copy(restrictedProto);
    return true;
  }

  if (!isCompatible(restrictedProto)) return false;
  copy(restrictedProto);		// Convert ourselves to restrictedProto
  //  if (!isInputLocked()) return false;
  if (isDotdotdot() && (!isinputactive)) return false;

  // Redo all the varnode inputs (if possible)
  if (isInputLocked())
    if (!transferLockedInput(newinput)) return false;
  // Redo all the varnode outputs (if possible)
  if (isOutputLocked())
    if (!transferLockedOutput(newoutput)) return false;

  return true;
}